

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cc
# Opt level: O0

void __thiscall raptor::TcpServer::OnErrorEvent(TcpServer *this)

{
  void *in_RSI;
  
  OnErrorEvent((TcpServer *)&this[-1]._last_timeout_time,in_RSI);
  return;
}

Assistant:

void TcpServer::OnErrorEvent(void* ptr) {
    ConnectionId cid = (ConnectionId)ptr;
    uint32_t index = CheckConnectionId(cid);
    if (index == InvalidIndex) {
        log_error("tcpserver: OnErrorEvent found invalid index, cid = %x", cid);
        return;
    }

    auto con = GetConnection(index);
    if (con) {
        con->Shutdown(true);
        DeleteConnection(index);
    }
}